

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O3

int32_t uset_toPattern_63(USet *set,UChar *result,int32_t resultCapacity,UBool escapeUnprintable,
                         UErrorCode *ec)

{
  int32_t iVar1;
  UnicodeString pat;
  Char16Ptr local_70;
  UChar *local_68;
  UnicodeString local_58;
  
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  icu_63::UnicodeSet::toPattern((UnicodeSet *)set,&local_58,escapeUnprintable);
  local_70.p_ = result;
  iVar1 = icu_63::UnicodeString::extract(&local_58,&local_70,resultCapacity,ec);
  local_68 = local_70.p_;
  icu_63::UnicodeString::~UnicodeString(&local_58);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uset_toPattern(const USet* set,
               UChar* result, int32_t resultCapacity,
               UBool escapeUnprintable,
               UErrorCode* ec) {
    UnicodeString pat;
    ((const UnicodeSet*) set)->toPattern(pat, escapeUnprintable);
    return pat.extract(result, resultCapacity, *ec);
}